

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::initMultisamplePrograms
               (SourceCollections *sources,GeometryType geometryType)

{
  ostream *poVar1;
  ProgramSources *pPVar2;
  char *pcVar3;
  allocator<char> local_281;
  string local_280;
  ShaderSource local_260;
  allocator<char> local_231;
  string local_230;
  string local_210;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream vertexSource;
  GeometryType geometryType_local;
  SourceCollections *sources_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,
                           "#version 310 es\nlayout(location = 0) in vec4 position;\nlayout(location = 1) in vec4 color;\nlayout(location = 0) out highp vec4 vtxColor;\nvoid main (void)\n{\n\tgl_Position = position;\n\tvtxColor = color;\n"
                          );
  pcVar3 = "";
  if (geometryType == GEOMETRY_TYPE_OPAQUE_POINT) {
    pcVar3 = "\tgl_PointSize = 3.0f;\n";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  std::operator<<(poVar1,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"color_vert",&local_1c1);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&sources->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_1f0,&local_210);
  glu::ProgramSources::operator<<(pPVar2,&local_1f0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"color_frag",&local_231);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&sources->glslSources,&local_230);
  pcVar3 = initMultisamplePrograms::fragmentSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,pcVar3,&local_281);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_260,&local_280);
  glu::ProgramSources::operator<<(pPVar2,&local_260);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void initMultisamplePrograms (SourceCollections& sources, GeometryType geometryType)
{
	std::ostringstream vertexSource;

	vertexSource <<
		"#version 310 es\n"
		"layout(location = 0) in vec4 position;\n"
		"layout(location = 1) in vec4 color;\n"
		"layout(location = 0) out highp vec4 vtxColor;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = position;\n"
		"	vtxColor = color;\n"
		<< (geometryType == GEOMETRY_TYPE_OPAQUE_POINT ? "	gl_PointSize = 3.0f;\n"
														 : "" )
		<< "}\n";

	static const char* fragmentSource =
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 vtxColor;\n"
		"layout(location = 0) out highp vec4 fragColor;\n"
		"void main (void)\n"
		"{\n"
		"	fragColor = vtxColor;\n"
		"}\n";

	sources.glslSources.add("color_vert") << glu::VertexSource(vertexSource.str());
	sources.glslSources.add("color_frag") << glu::FragmentSource(fragmentSource);
}